

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialTransaction::SetElementsTxState(ConfidentialTransaction *this)

{
  long lVar1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  long lVar7;
  size_t is_coinbase;
  
  pvVar2 = (this->super_AbstractTransaction).wally_tx_pointer_;
  if ((pvVar2 != (void *)0x0) && (iVar4 = wally_tx_is_coinbase(pvVar2), iVar4 == 0)) {
    uVar3 = *(ulong *)((long)pvVar2 + 0x10);
    for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
      lVar7 = (ulong)uVar5 * 0xd0;
      lVar1 = *(long *)((long)pvVar2 + 8) + lVar7;
      lVar7 = *(long *)(*(long *)((long)pvVar2 + 8) + 200 + lVar7);
      if ((lVar7 == 0) || (*(long *)(lVar7 + 8) == 0)) {
        bVar6 = *(byte *)(lVar1 + 0x40) & 0xfb;
      }
      else {
        bVar6 = *(byte *)(lVar1 + 0x40) | 4;
      }
      if (((*(long *)(lVar1 + 0x88) == 0) || (*(long *)(lVar1 + 0x90) == 0)) &&
         ((*(long *)(lVar1 + 0x98) == 0 || (*(long *)(lVar1 + 0xa0) == 0)))) {
        bVar6 = bVar6 & 0xfd;
      }
      else {
        bVar6 = bVar6 | 2;
      }
      *(byte *)(lVar1 + 0x40) = bVar6;
    }
  }
  return;
}

Assistant:

void ConfidentialTransaction::SetElementsTxState() {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer != nullptr) {
    size_t is_coinbase = 0;
    // coinbase priority when coinbase is set
    int ret = wally_tx_is_coinbase(tx_pointer, &is_coinbase);
    if ((ret == WALLY_OK) && (is_coinbase == 0)) {
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        struct wally_tx_input *input = tx_pointer->inputs + i;
        // pegin_witness
        if ((input->pegin_witness != nullptr) &&
            (input->pegin_witness->num_items != 0)) {
          input->features |= kTxInFeaturePegin;
        } else {
          input->features &= ~kTxInFeaturePegin;
        }

        // issuance
        if (((input->issuance_amount != nullptr) &&
             (input->issuance_amount_len != 0)) ||
            ((input->inflation_keys != nullptr) &&
             (input->inflation_keys_len != 0))) {
          input->features |= kTxInFeatureIssuance;
        } else {
          input->features &= ~kTxInFeatureIssuance;
        }
      }
    }
  }
}